

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string_t __thiscall
duckdb::UhugeintToStringCast::Format(UhugeintToStringCast *this,uhugeint_t value,Vector *vector)

{
  ulong uVar1;
  idx_t len;
  undefined1 *__dest;
  string_t result;
  string str;
  undefined1 local_50 [16];
  string local_40;
  uhugeint_t local_20;
  
  local_20.upper = value.lower;
  local_20.lower = (uint64_t)this;
  uhugeint_t::ToString_abi_cxx11_(&local_40,&local_20);
  local_50 = (undefined1  [16])
             StringVector::EmptyString
                       ((StringVector *)value.upper,(Vector *)local_40._M_string_length,len);
  __dest = local_50._8_8_;
  if (local_50._0_4_ < 0xd) {
    __dest = local_50 + 4;
  }
  switchD_012e1ce8::default(__dest,local_40._M_dataplus._M_p,local_40._M_string_length);
  uVar1 = (ulong)(uint)local_50._0_4_;
  if (uVar1 < 0xd) {
    switchD_0130b471::default(local_50 + 4 + uVar1,0,0xc - uVar1);
  }
  else {
    local_50._4_4_ = *(undefined4 *)local_50._8_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50;
}

Assistant:

static string_t Format(uhugeint_t value, Vector &vector) {
		std::string str = value.ToString();
		string_t result = StringVector::EmptyString(vector, str.length());
		auto data = result.GetDataWriteable();

		memcpy(data, str.data(), str.length()); // NOLINT: null-termination not required
		result.Finalize();
		return result;
	}